

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O2

wchar_t project_player_handler_SHARD(project_player_handler_context_t *context)

{
  player *p;
  _Bool _Var1;
  uint32_t uVar2;
  long lVar3;
  player_state_conflict *ppVar4;
  undefined1 *puVar5;
  player_state_conflict in_stack_fffffffffffffea8;
  
  ppVar4 = &player->state;
  puVar5 = &stack0xfffffffffffffea8;
  for (lVar3 = 0x13c; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = (char)ppVar4->stat_add[0];
    ppVar4 = (player_state_conflict *)((long)ppVar4->stat_add + 1);
    puVar5 = puVar5 + 1;
  }
  _Var1 = player_resists_effects(in_stack_fffffffffffffea8,L'\b');
  p = player;
  if (_Var1) {
    msg("You resist the effect!");
  }
  else {
    uVar2 = Rand_div(context->dam);
    player_inc_timed(p,L'\b',uVar2 + L'\x01',true,true,false);
  }
  return L'\0';
}

Assistant:

static int project_player_handler_SHARD(project_player_handler_context_t *context)
{
	if (player_resists_effects(player->state, ELEM_SHARD)) {
		msg("You resist the effect!");
		return 0;
	}

	/* Cuts */
	(void)player_inc_timed(player, TMD_CUT, randint1(context->dam), true,
		true, false);
	return 0;
}